

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizerAndResolverTester.cpp
# Opt level: O2

void __thiscall
psy::C::TypeCanonicalizerAndResolverTester::case0039(TypeCanonicalizerAndResolverTester *this)

{
  allocator<char> local_e1;
  string local_e0;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"\nstruct s { int m ; } ;\nvoid _ ( )\n{\n    struct s x ;\n}\n",
             &local_e1);
  Expectation::Expectation(&local_c0);
  canonicalizerAndResolveTypes(this,&local_e0,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void TypeCanonicalizerAndResolverTester::case0039()
{
    auto s = R"(
struct s { int m ; } ;
void _ ( )
{
    struct s x ;
}
)";

    canonicalizerAndResolveTypes(s, Expectation());
}